

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::EmbeddingNDLayerParams::ByteSizeLong(EmbeddingNDLayerParams *this)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  
  if (this->weights_ == (WeightParams *)0x0 ||
      this == (EmbeddingNDLayerParams *)&_EmbeddingNDLayerParams_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = WeightParams::ByteSizeLong(this->weights_);
    uVar6 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (EmbeddingNDLayerParams *)&_EmbeddingNDLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->bias_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->vocabsize_ != 0) {
    uVar5 = this->vocabsize_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->embeddingsize_ != 0) {
    uVar5 = this->embeddingsize_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3 + 2;
  if (this->hasbias_ == false) {
    sVar4 = sVar3;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t EmbeddingNDLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.EmbeddingNDLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams weights = 20;
  if (this->has_weights()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 21;
  if (this->has_bias()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint64 vocabSize = 1;
  if (this->vocabsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->vocabsize());
  }

  // uint64 embeddingSize = 2;
  if (this->embeddingsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->embeddingsize());
  }

  // bool hasBias = 3;
  if (this->hasbias() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}